

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_ffqr_df_mipsel(CPUMIPSState_conflict4 *env,uint32_t df,uint32_t wd,uint32_t ws)

{
  float_status *pfVar1;
  fpr_t *pfVar2;
  long lVar3;
  uint uVar4;
  float32 fVar5;
  float64 fVar6;
  long lVar7;
  float_status *status;
  wr_t wx;
  float64 local_48 [3];
  
  lVar3 = (ulong)ws * 0x10 + 0x228;
  if (df == 2) {
    pfVar1 = &(env->active_tc).msa_fp_status;
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar5 = float32_from_q16(*(int16_t *)
                                ((long)(env->active_fpu).fpr + lVar7 * 2 + lVar3 + -0x228),pfVar1);
      *(float32 *)((long)local_48 + lVar7 * 4) = fVar5;
      uVar4 = update_msacsr(env,0,(uint)((fVar5 & 0x7f800000) == 0 && (fVar5 & 0x7fffffff) != 0));
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar4) != 0) {
        fVar5 = float32_default_nan_mipsel(pfVar1);
        *(float32 *)((long)local_48 + lVar7 * 4) = fVar5 & 0xffffffc0 ^ 0x400000 | uVar4;
      }
    }
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1c79,
                    "void helper_msa_ffqr_df_mipsel(CPUMIPSState *, uint32_t, uint32_t, uint32_t)");
    }
    pfVar1 = &(env->active_tc).msa_fp_status;
    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar6 = float64_from_q32(*(int32_t *)
                                ((long)(env->active_fpu).fpr + lVar7 * 4 + lVar3 + -0x228),pfVar1);
      local_48[lVar7] = fVar6;
      uVar4 = update_msacsr(env,0,(uint)((fVar6 & 0x7ff0000000000000) == 0 &&
                                        (fVar6 & 0x7fffffffffffffff) != 0));
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar4) != 0) {
        fVar6 = float64_default_nan_mipsel(pfVar1);
        local_48[lVar7] = (long)(int)uVar4 | fVar6 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
    }
  }
  pfVar2 = (env->active_fpu).fpr + wd;
  pfVar2->fd = local_48[0];
  (&pfVar2->fd)[1] = local_48[1];
  return;
}

Assistant:

void helper_msa_ffqr_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                        uint32_t ws)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    uint32_t i;

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_UNOP(pwx->w[i], from_q16, Rh(pws, i), 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_UNOP(pwx->d[i], from_q32, Rw(pws, i), 64);
        }
        break;
    default:
        assert(0);
    }

    msa_move_v(pwd, pwx);
}